

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_0::NotCurrentSurfaceTest2::iterate(NotCurrentSurfaceTest2 *this)

{
  EGLDisplay pvVar1;
  TestLog *log;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  EGLBoolean EVar5;
  Library *egl;
  EGLConfig pvVar6;
  undefined4 extraout_var;
  allocator<char> local_ea;
  allocator<char> local_e9;
  string local_e8;
  int bufferAge;
  string local_c0;
  CallLogWrapper wrapper;
  EGLint damageRegion [4];
  ScopedLogSection local_78;
  ScopedLogSection local_70;
  ScopedLogSection local_68;
  UniqueSurface dummyPbuffer;
  EGLint attribList [5];
  
  egl = EglTestContext::getLibrary
                  ((this->super_NegativePartialUpdateTest).super_TestCase.m_eglTestCtx);
  pvVar6 = getEGLConfig(egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,SURFACETYPE_PBUFFER
                        ,false);
  pvVar1 = (this->super_NegativePartialUpdateTest).m_eglDisplay;
  iVar3 = (*egl->_vptr_Library[10])(egl,pvVar1,pvVar6);
  eglu::UniqueSurface::UniqueSurface
            (&dummyPbuffer,egl,pvVar1,(EGLSurface)CONCAT44(extraout_var,iVar3));
  log = ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
        m_testCtx)->m_log;
  eglu::CallLogWrapper::CallLogWrapper(&wrapper,egl,log);
  bufferAge = -1;
  damageRegion[0] = 10;
  damageRegion[1] = 10;
  damageRegion[2] = 10;
  damageRegion[3] = 10;
  wrapper.m_enableLog = true;
  tcu::TestContext::setTestResult
            ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  (*egl->_vptr_Library[0x30])
            (egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,
             (this->super_NegativePartialUpdateTest).m_eglSurface,0x3093,0x3095);
  dVar4 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar4,
                   "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                   ,0x203);
  (*egl->_vptr_Library[0x2b])
            (egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,
             (this->super_NegativePartialUpdateTest).m_eglSurface,0x313d,&bufferAge);
  dVar4 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar4,"querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                   ,0x204);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Test7",&local_e9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,
             "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH"
             ,&local_ea);
  tcu::ScopedLogSection::ScopedLogSection(&local_68,log,&local_e8,&local_c0);
  tcu::ScopedLogSection::~ScopedLogSection(&local_68);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e8);
  (*egl->_vptr_Library[0x27])
            (egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,dummyPbuffer.m_surface,
             dummyPbuffer.m_surface,(this->super_NegativePartialUpdateTest).m_eglContext);
  dVar4 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar4,"makeCurrent(m_eglDisplay, *dummyPbuffer, *dummyPbuffer, m_eglContext)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                   ,0x208);
  EVar5 = eglu::CallLogWrapper::eglSetDamageRegionKHR
                    (&wrapper,(this->super_NegativePartialUpdateTest).m_eglDisplay,
                     (this->super_NegativePartialUpdateTest).m_eglSurface,damageRegion,1);
  NegativePartialUpdateTest::expectFalse(&this->super_NegativePartialUpdateTest,EVar5);
  NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3009);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Test8",&local_e9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,
             "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH"
             ,&local_ea);
  tcu::ScopedLogSection::ScopedLogSection(&local_70,log,&local_e8,&local_c0);
  tcu::ScopedLogSection::~ScopedLogSection(&local_70);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e8);
  (*egl->_vptr_Library[0x27])(egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,0,0,0);
  dVar4 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar4,"makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                   ,0x20e);
  EVar5 = eglu::CallLogWrapper::eglSetDamageRegionKHR
                    (&wrapper,(this->super_NegativePartialUpdateTest).m_eglDisplay,
                     (this->super_NegativePartialUpdateTest).m_eglSurface,damageRegion,1);
  NegativePartialUpdateTest::expectFalse(&this->super_NegativePartialUpdateTest,EVar5);
  NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3009);
  pvVar1 = (this->super_NegativePartialUpdateTest).m_eglDisplay;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"EGL_KHR_surfaceless_context",(allocator<char> *)&local_c0);
  bVar2 = eglu::hasExtension(egl,pvVar1,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Test9",&local_e9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,
               "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH"
               ,&local_ea);
    tcu::ScopedLogSection::ScopedLogSection(&local_78,log,&local_e8,&local_c0);
    tcu::ScopedLogSection::~ScopedLogSection(&local_78);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e8);
    (*egl->_vptr_Library[0x27])
              (egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,0,0,
               (this->super_NegativePartialUpdateTest).m_eglContext);
    dVar4 = (*egl->_vptr_Library[0x1f])(egl);
    eglu::checkError(dVar4,"makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, m_eglContext)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                     ,0x215);
    EVar5 = eglu::CallLogWrapper::eglSetDamageRegionKHR
                      (&wrapper,(this->super_NegativePartialUpdateTest).m_eglDisplay,
                       (this->super_NegativePartialUpdateTest).m_eglSurface,damageRegion,1);
    NegativePartialUpdateTest::expectFalse(&this->super_NegativePartialUpdateTest,EVar5);
    NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3009);
  }
  eglu::CallLogWrapper::~CallLogWrapper(&wrapper);
  eglu::UniqueSurface::~UniqueSurface(&dummyPbuffer);
  return STOP;
}

Assistant:

TestCase::IterateResult NotCurrentSurfaceTest2::iterate (void)
{
	const Library&				egl				= m_eglTestCtx.getLibrary();
	const EGLConfig				config			= getEGLConfig(egl, m_eglDisplay, SURFACETYPE_PBUFFER, false);
	const EGLint				attribList[]	=
	{
		EGL_WIDTH,	64,
		EGL_HEIGHT,	64,
		EGL_NONE
	};
	const eglu::UniqueSurface	dummyPbuffer	(egl, m_eglDisplay, egl.createPbufferSurface(m_eglDisplay, config, attribList));
	TestLog&					log				= m_testCtx.getLog();
	CallLogWrapper				wrapper			(egl, log);
	EGLint						damageRegion[]	= { 10, 10, 10, 10 };
	int							bufferAge		= -1;

	wrapper.enableLogging(true);
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));
	EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge));

	{
		tcu::ScopedLogSection(log, "Test7", "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH");
		EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, *dummyPbuffer, *dummyPbuffer, m_eglContext));
		expectFalse(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, damageRegion, 1));
		expectError(EGL_BAD_MATCH);
	}
	{
		tcu::ScopedLogSection(log, "Test8", "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH");
		EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
		expectFalse(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, damageRegion, 1));
		expectError(EGL_BAD_MATCH);
	}
	if (hasExtension(egl, m_eglDisplay, "EGL_KHR_surfaceless_context"))
	{
		tcu::ScopedLogSection(log, "Test9", "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH");
		EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, m_eglContext));
		expectFalse(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, damageRegion, 1));
		expectError(EGL_BAD_MATCH);
	}

	return STOP;
}